

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::resetResources(MemoryTestInstance *this)

{
  VkResult result;
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  size_type sVar3;
  reference ppCVar4;
  ulong local_28;
  size_t commandNdx;
  VkDevice device;
  DeviceInterface *vkd;
  MemoryTestInstance *this_local;
  
  pDVar1 = vkt::Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar2 = vkt::Context::getDevice((this->super_TestInstance).m_context);
  result = (*pDVar1->_vptr_DeviceInterface[4])(pDVar1,pVVar2);
  ::vk::checkResult(result,"vkd.deviceWaitIdle(device)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x23a2);
  local_28 = 0;
  while( true ) {
    sVar3 = std::
            vector<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
            ::size(&this->m_commands);
    if (sVar3 <= local_28) break;
    ppCVar4 = std::
              vector<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
              ::operator[](&this->m_commands,local_28);
    if (*ppCVar4 != (value_type)0x0) {
      (*(*ppCVar4)->_vptr_Command[1])();
    }
    ppCVar4 = std::
              vector<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
              ::operator[](&this->m_commands,local_28);
    *ppCVar4 = (value_type)0x0;
    local_28 = local_28 + 1;
  }
  std::
  vector<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
  ::clear(&this->m_commands);
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  ::clear(&this->m_prepareContext);
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
  ::clear(&this->m_memory);
  return;
}

Assistant:

void MemoryTestInstance::resetResources (void)
{
	const vk::DeviceInterface&	vkd		= m_context.getDeviceInterface();
	const vk::VkDevice			device	= m_context.getDevice();

	VK_CHECK(vkd.deviceWaitIdle(device));

	for (size_t commandNdx = 0; commandNdx < m_commands.size(); commandNdx++)
	{
		delete m_commands[commandNdx];
		m_commands[commandNdx] = DE_NULL;
	}

	m_commands.clear();
	m_prepareContext.clear();
	m_memory.clear();
}